

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint newSize;
  uint uVar1;
  hash_t hVar2;
  SimpleHashedEntry<unsigned_int,_unsigned_int> *dst;
  int *piVar3;
  int iVar4;
  size_t byteSize;
  long lVar5;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  newSize = this->count * 2;
  local_34[0] = 0x4b;
  uVar1 = 4;
  if (8 < newSize) {
    uVar1 = this->count & 0x7fffffff;
  }
  uVar1 = PrimePolicy::GetPrime(uVar1,local_34);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (uVar1 == this->bucketCount) {
    byteSize = 0xffffffffffffffff;
    if (-1 < (int)newSize) {
      byteSize = (ulong)newSize << 3;
    }
    dst = (SimpleHashedEntry<unsigned_int,_unsigned_int> *)
          Memory::NoCheckHeapAllocator::AllocZero(this->alloc,byteSize);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<unsigned_int,unsigned_int>,unsigned_int,Memory::NoCheckHeapAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,uVar1,newSize);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<unsigned_int,unsigned_int>,unsigned_int,Memory::NoCheckHeapAllocator>
              ((SimpleHashedEntry<unsigned_int,_unsigned_int> *)newBuckets,(long)(int)newSize,
               this->entries,(long)this->count);
    this->modFunctionIndex = local_34[0];
    iVar4 = this->count;
    if (0 < iVar4) {
      lVar5 = 0;
      piVar3 = newBuckets;
      do {
        if (-2 < piVar3[lVar5 * 2 + 1]) {
          hVar2 = PrimePolicy::ModPrime(piVar3[lVar5 * 2] & 0x7fffffff,uVar1,this->modFunctionIndex)
          ;
          newBuckets[lVar5 * 2 + 1] = local_48[(int)hVar2];
          local_48[(int)hVar2] = (int)lVar5;
          iVar4 = this->count;
          piVar3 = newBuckets;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar4);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = uVar1;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }